

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_test.cc
# Opt level: O0

void __thiscall AESTest_WrapBadLengths_Test::TestBody(AESTest_WrapBadLengths_Test *this)

{
  allocator<unsigned_char> *paVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  uchar *out_00;
  uchar *in_00;
  AssertHelper local_1f0;
  Message local_1e8;
  int local_1e0 [2];
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_1c0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> out;
  undefined1 local_1a0 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> in;
  size_type sStack_180;
  ScopedTrace gtest_trace_259;
  size_t len;
  size_t *__end1;
  size_t *__begin1;
  size_t (*__range1) [17];
  AssertHelper local_158;
  Message local_150 [3];
  int local_138 [2];
  undefined1 local_130 [8];
  AssertionResult gtest_ar;
  AES_KEY aes;
  uint8_t key [16];
  AESTest_WrapBadLengths_Test *this_local;
  
  aes.rd_key[0x3b] = 0;
  aes.rounds = 0;
  local_138[1] = 0;
  local_138[0] = AES_set_encrypt_key((uchar *)(aes.rd_key + 0x3b),0x80,
                                     (AES_KEY *)
                                     ((long)&gtest_ar.message_._M_t.
                                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             .
                                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     + 4));
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_130,"0","AES_set_encrypt_key(key, 128, &aes)",local_138 + 1,local_138
            );
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar2) {
    testing::Message::Message(local_150);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              (&local_158,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/aes/aes_test.cc"
               ,0xfd,pcVar3);
    testing::internal::AssertHelper::operator=(&local_158,local_150);
    testing::internal::AssertHelper::~AssertHelper(&local_158);
    testing::Message::~Message(local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  if (bVar2) {
    for (__end1 = TestBody::kLengths; __end1 != (size_t *)""; __end1 = __end1 + 1) {
      sStack_180 = *__end1;
      testing::ScopedTrace::ScopedTrace<unsigned_long>
                ((ScopedTrace *)
                 ((long)&in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/aes/aes_test.cc"
                 ,0x103,&stack0xfffffffffffffe80);
      sVar4 = sStack_180;
      paVar1 = (allocator<unsigned_char> *)
               ((long)&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<unsigned_char>::allocator(paVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0,sVar4,paVar1);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      sVar4 = sStack_180 + 8;
      paVar1 = (allocator<unsigned_char> *)
               ((long)&gtest_ar_1.message_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               + 7);
      std::allocator<unsigned_char>::allocator(paVar1);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0,sVar4,paVar1);
      std::allocator<unsigned_char>::~allocator
                ((allocator<unsigned_char> *)
                 ((long)&gtest_ar_1.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7));
      local_1e0[1] = 0xffffffff;
      out_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
      in_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
      sVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
      local_1e0[0] = AES_wrap_key((AES_KEY *)
                                  ((long)&gtest_ar.message_._M_t.
                                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          .
                                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  + 4),(uchar *)0x0,out_00,in_00,(uint)sVar4);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_1d8,"-1",
                 "AES_wrap_key(&aes, nullptr, out.data(), in.data(), in.size())",local_1e0 + 1,
                 local_1e0);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
      if (!bVar2) {
        testing::Message::Message(&local_1e8);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
        testing::internal::AssertHelper::AssertHelper
                  (&local_1f0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/aes/aes_test.cc"
                   ,0x107,pcVar3);
        testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
        testing::internal::AssertHelper::~AssertHelper(&local_1f0);
        testing::Message::~Message(&local_1e8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1c0);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a0);
      testing::ScopedTrace::~ScopedTrace
                ((ScopedTrace *)
                 ((long)&in.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    }
  }
  return;
}

Assistant:

TEST(AESTest, WrapBadLengths) {
  uint8_t key[128/8] = {0};
  AES_KEY aes;
  ASSERT_EQ(0, AES_set_encrypt_key(key, 128, &aes));

  // Input lengths to |AES_wrap_key| must be a multiple of 8 and at least 16.
  static const size_t kLengths[] = {0, 1,  2,  3,  4,  5,  6,  7, 8,
                                    9, 10, 11, 12, 13, 14, 15, 20};
  for (size_t len : kLengths) {
    SCOPED_TRACE(len);
    std::vector<uint8_t> in(len);
    std::vector<uint8_t> out(len + 8);
    EXPECT_EQ(-1,
              AES_wrap_key(&aes, nullptr, out.data(), in.data(), in.size()));
  }
}